

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcpaddress.cpp
# Opt level: O1

RTPAddress * __thiscall
jrtplib::RTPTCPAddress::CreateCopy(RTPTCPAddress *this,RTPMemoryManager *mgr)

{
  undefined4 uVar1;
  RTPAddress *pRVar2;
  
  if (mgr == (RTPMemoryManager *)0x0) {
    pRVar2 = (RTPAddress *)operator_new(0x10);
  }
  else {
    pRVar2 = (RTPAddress *)(**(code **)(*(long *)mgr + 0x10))(mgr,0x10,0x17);
  }
  uVar1 = *(undefined4 *)&(this->super_RTPAddress).field_0xc;
  pRVar2->addresstype = TCPAddress;
  pRVar2->_vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_0013ccf8;
  *(undefined4 *)&pRVar2->field_0xc = uVar1;
  return pRVar2;
}

Assistant:

RTPAddress *RTPTCPAddress::CreateCopy(RTPMemoryManager *mgr) const
{
	JRTPLIB_UNUSED(mgr); // possibly unused
	RTPTCPAddress *a = RTPNew(mgr,RTPMEM_TYPE_CLASS_RTPADDRESS) RTPTCPAddress(m_socket);
	return a;
}